

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O0

int sat_solver_clause_new(sat_solver *s,lit *begin,lit *end,int learnt)

{
  lit lVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  veci *pvVar6;
  clause *c_00;
  uint local_9c;
  uint local_84;
  int h;
  clause *c;
  int size;
  int fUseBinaryClauses;
  int learnt_local;
  lit *end_local;
  lit *begin_local;
  sat_solver *s_local;
  
  if ((long)end - (long)begin >> 2 < 2) {
    __assert_fail("end - begin > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x21a,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
  }
  if ((learnt < 0) || (1 < learnt)) {
    __assert_fail("learnt >= 0 && learnt < 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x21b,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
  }
  iVar2 = (int)((long)end - (long)begin >> 2);
  if ((iVar2 == 2) && (learnt == 0)) {
    lVar1 = lit_neg(*begin);
    pvVar6 = sat_solver_read_wlist(s,lVar1);
    iVar2 = clause_from_lit(begin[1]);
    veci_push(pvVar6,iVar2);
    lVar1 = lit_neg(begin[1]);
    pvVar6 = sat_solver_read_wlist(s,lVar1);
    iVar2 = clause_from_lit(*begin);
    veci_push(pvVar6,iVar2);
    (s->stats).clauses = (s->stats).clauses + 1;
    (s->stats).clauses_literals = (s->stats).clauses_literals + 2;
    s_local._4_4_ = 0;
  }
  else {
    s_local._4_4_ = Sat_MemAppend(&s->Mem,begin,iVar2,learnt,0);
    if ((s_local._4_4_ & 1) != 0) {
      __assert_fail("!(h & 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                    ,0x22b,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
    }
    if ((s->hLearnts == -1) && (learnt != 0)) {
      s->hLearnts = s_local._4_4_;
    }
    if (learnt == 0) {
      (s->stats).clauses = (s->stats).clauses + 1;
      (s->stats).clauses_literals = (long)iVar2 + (s->stats).clauses_literals;
    }
    else {
      c_00 = clause_read(s,s_local._4_4_);
      uVar3 = sat_clause_compute_lbd(s,c_00);
      *c_00 = (clause)((uint)*c_00 & 0xfffff807 | (uVar3 & 0xff) << 3);
      iVar4 = clause_id(c_00);
      iVar5 = veci_size(&s->act_clas);
      if (iVar4 != iVar5) {
        __assert_fail("clause_id(c) == veci_size(&s->act_clas)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                      ,0x232,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
      }
      if (s->ClaActType == 0) {
        veci_push(&s->act_clas,0x400);
      }
      else {
        veci_push(&s->act_clas,s->cla_inc);
      }
      (s->stats).learnts = (s->stats).learnts + 1;
      (s->stats).learnts_literals = (long)iVar2 + (s->stats).learnts_literals;
    }
    if (*begin < 0) {
      __assert_fail("begin[0] >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                    ,0x242,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
    }
    if (SBORROW4(*begin,s->size * 2) == *begin + s->size * -2 < 0) {
      __assert_fail("begin[0] < s->size*2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                    ,0x243,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
    }
    if (begin[1] < 0) {
      __assert_fail("begin[1] >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                    ,0x244,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
    }
    if (SBORROW4(begin[1],s->size * 2) == begin[1] + s->size * -2 < 0) {
      __assert_fail("begin[1] < s->size*2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                    ,0x245,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
    }
    lVar1 = lit_neg(*begin);
    if (SBORROW4(lVar1,s->size * 2) == lVar1 + s->size * -2 < 0) {
      __assert_fail("lit_neg(begin[0]) < s->size*2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                    ,0x247,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
    }
    lVar1 = lit_neg(begin[1]);
    if (SBORROW4(lVar1,s->size * 2) == lVar1 + s->size * -2 < 0) {
      __assert_fail("lit_neg(begin[1]) < s->size*2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                    ,0x248,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
    }
    lVar1 = lit_neg(*begin);
    pvVar6 = sat_solver_read_wlist(s,lVar1);
    local_84 = s_local._4_4_;
    if (iVar2 < 3) {
      local_84 = clause_from_lit(begin[1]);
    }
    veci_push(pvVar6,local_84);
    lVar1 = lit_neg(begin[1]);
    pvVar6 = sat_solver_read_wlist(s,lVar1);
    local_9c = s_local._4_4_;
    if (iVar2 < 3) {
      local_9c = clause_from_lit(*begin);
    }
    veci_push(pvVar6,local_9c);
  }
  return s_local._4_4_;
}

Assistant:

int sat_solver_clause_new(sat_solver* s, lit* begin, lit* end, int learnt)
{
    int fUseBinaryClauses = 1;
    int size;
    clause* c;
    int h;

    assert(end - begin > 1);
    assert(learnt >= 0 && learnt < 2);
    size           = end - begin;

    // do not allocate memory for the two-literal problem clause
    if ( fUseBinaryClauses && size == 2 && !learnt )
    {
        veci_push(sat_solver_read_wlist(s,lit_neg(begin[0])),(clause_from_lit(begin[1])));
        veci_push(sat_solver_read_wlist(s,lit_neg(begin[1])),(clause_from_lit(begin[0])));
        s->stats.clauses++;
        s->stats.clauses_literals += size;
        return 0;
    }

    // create new clause
//    h = Vec_SetAppend( &s->Mem, NULL, size + learnt + 1 + 1 ) << 1;
    h = Sat_MemAppend( &s->Mem, begin, size, learnt, 0 );
    assert( !(h & 1) );
    if ( s->hLearnts == -1 && learnt )
        s->hLearnts = h;
    if (learnt)
    {
        c = clause_read( s, h );
        c->lbd = sat_clause_compute_lbd( s, c );
        assert( clause_id(c) == veci_size(&s->act_clas) );
//        veci_push(&s->learned, h);
//        act_clause_bump(s,clause_read(s, h));
        if ( s->ClaActType == 0 )
            veci_push(&s->act_clas, (1<<10));
        else
            veci_push(&s->act_clas, s->cla_inc);
        s->stats.learnts++;
        s->stats.learnts_literals += size;
    }
    else
    {
        s->stats.clauses++;
        s->stats.clauses_literals += size;
    }

    assert(begin[0] >= 0);
    assert(begin[0] < s->size*2);
    assert(begin[1] >= 0);
    assert(begin[1] < s->size*2);

    assert(lit_neg(begin[0]) < s->size*2);
    assert(lit_neg(begin[1]) < s->size*2);

    //veci_push(sat_solver_read_wlist(s,lit_neg(begin[0])),c);
    //veci_push(sat_solver_read_wlist(s,lit_neg(begin[1])),c);
    veci_push(sat_solver_read_wlist(s,lit_neg(begin[0])),(size > 2 ? h : clause_from_lit(begin[1])));
    veci_push(sat_solver_read_wlist(s,lit_neg(begin[1])),(size > 2 ? h : clause_from_lit(begin[0])));

    return h;
}